

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void VW::start_parser(vw *all)

{
  thread local_18;
  vw *local_10;
  
  local_10 = all;
  std::thread::thread<void(&)(vw*),vw*,void>(&local_18,main_parse_loop,&local_10);
  if ((all->parse_thread)._M_id._M_thread == 0) {
    (all->parse_thread)._M_id._M_thread = (native_handle_type)local_18._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void start_parser(vw& all) { all.parse_thread = std::thread(main_parse_loop, &all); }